

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<char> __thiscall
c4::basic_substring<char>::trimr(basic_substring<char> *this,ro_substr chars)

{
  ro_substr chars_00;
  basic_substring<char> bVar1;
  error_flags eVar2;
  size_t sVar3;
  ulong uVar4;
  long *in_RDI;
  bool bVar5;
  size_t pos;
  size_t rnum_1;
  size_t rnum;
  undefined5 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  char *in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  undefined1 uVar6;
  ulong local_138;
  undefined5 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed5;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  basic_substring<char> *in_stack_fffffffffffffed8;
  char *local_d8;
  size_t local_d0;
  char *local_78;
  size_t local_70;
  char *local_18;
  size_t local_10;
  
  bVar5 = true;
  if (in_RDI[1] != 0) {
    bVar5 = *in_RDI == 0;
  }
  if ((bVar5) ||
     (chars_00.len = (size_t)in_RDI, chars_00.str = (char *)in_RDI,
     sVar3 = last_not_of(in_stack_fffffffffffffed8,chars_00,
                         CONCAT17(in_stack_fffffffffffffed7,
                                  CONCAT16(in_stack_fffffffffffffed6,
                                           CONCAT15(in_stack_fffffffffffffed5,
                                                    in_stack_fffffffffffffed0)))),
     sVar3 == 0xffffffffffffffff)) {
    basic_substring((basic_substring<char> *)
                    CONCAT17(in_stack_fffffffffffffec7,
                             CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                    (char *)in_RDI,
                    CONCAT17(in_stack_fffffffffffffeb7,
                             CONCAT16(1,CONCAT15(in_stack_fffffffffffffeb5,in_stack_fffffffffffffeb0
                                                ))));
    local_d8 = local_78;
    local_d0 = local_70;
  }
  else {
    uVar4 = sVar3 + 1;
    if ((ulong)in_RDI[1] < uVar4 && uVar4 != 0xffffffffffffffff) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      handle_error(0x3f0daf,(char *)0x153b,"check failed: %s",
                   "(num >= 0 && num <= len) || (num == npos)");
    }
    local_138 = uVar4;
    if (uVar4 == 0xffffffffffffffff) {
      local_138 = in_RDI[1];
    }
    uVar6 = local_138 <= (ulong)in_RDI[1] || uVar4 == 0;
    if (local_138 > (ulong)in_RDI[1] && uVar4 != 0) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) &&
         (in_stack_fffffffffffffec6 = is_debugger_attached(), (bool)in_stack_fffffffffffffec6)) {
        trap_instruction();
      }
      handle_error(0x3f0daf,(char *)0x153d,"check failed: %s",
                   "(first >= 0 && first + rnum <= len) || (num == 0)");
    }
    basic_substring((basic_substring<char> *)
                    CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                    in_stack_fffffffffffffeb8,
                    CONCAT17(in_stack_fffffffffffffeb7,
                             CONCAT16(in_stack_fffffffffffffeb6,
                                      CONCAT15(in_stack_fffffffffffffeb5,in_stack_fffffffffffffeb0))
                            ));
    local_d8 = local_18;
    local_d0 = local_10;
  }
  bVar1.len = local_d0;
  bVar1.str = local_d8;
  return bVar1;
}

Assistant:

basic_substring trimr(ro_substr chars) const
    {
        if( ! empty())
        {
            size_t pos = last_not_of(chars, npos);
            if(pos != npos)
                return sub(0, pos+1);
        }
        return sub(0, 0);
    }